

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::DynamicMessageTest_IndependentOffsets_Test::
DynamicMessageTest_IndependentOffsets_Test(DynamicMessageTest_IndependentOffsets_Test *this)

{
  DynamicMessageTest_IndependentOffsets_Test *this_local;
  
  DynamicMessageTest::DynamicMessageTest(&this->super_DynamicMessageTest);
  (this->super_DynamicMessageTest).super_TestWithParam<std::tuple<bool,_bool>_>.super_Test.
  _vptr_Test = (_func_int **)&PTR__DynamicMessageTest_IndependentOffsets_Test_029bcdb8;
  (this->super_DynamicMessageTest).super_TestWithParam<std::tuple<bool,_bool>_>.
  super_WithParamInterface<std::tuple<bool,_bool>_>._vptr_WithParamInterface =
       (_func_int **)&DAT_029bcdf8;
  return;
}

Assistant:

TEST_P(DynamicMessageTest, IndependentOffsets) {
  // Check that all fields have independent offsets by setting each
  // one to a unique value then checking that they all still have those
  // unique values (i.e. they don't stomp each other).
  Arena arena;
  Message* message = prototype_->New(use_arena() ? &arena : nullptr);
  TestUtil::ReflectionTester reflection_tester(descriptor_);

  reflection_tester.SetAllFieldsViaReflection(message);
  reflection_tester.ExpectAllFieldsSetViaReflection(*message);

  if (!use_arena()) {
    delete message;
  }
}